

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplaceRealloc<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *this,pointer pos,
          pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
          *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  Symbol *pSVar4;
  ConfigBlockSymbol *pCVar5;
  HierarchicalInstanceSyntax *pHVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer ppVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar14 = *(long *)(this + 8) + 1;
  uVar3 = *(ulong *)(this + 0x10);
  if (uVar14 < uVar3 * 2) {
    uVar14 = uVar3 * 2;
  }
  if (0x3ffffffffffffff - uVar3 < uVar3) {
    uVar14 = 0x3ffffffffffffff;
  }
  lVar15 = (long)pos - *(long *)this;
  puVar11 = (undefined8 *)operator_new(uVar14 << 5);
  pSVar4 = (args->first).definition;
  pCVar5 = (args->first).configRoot;
  pHVar6 = args->second;
  puVar1 = (undefined8 *)((long)puVar11 + lVar15 + 0x10);
  *puVar1 = (args->first).configRule;
  puVar1[1] = pHVar6;
  *(undefined8 *)((long)puVar11 + lVar15) = pSVar4;
  ((undefined8 *)((long)puVar11 + lVar15))[1] = pCVar5;
  p = *(pointer *)this;
  lVar12 = *(long *)(this + 8) * 0x20;
  lVar13 = (long)p + (lVar12 - (long)pos);
  ppVar10 = p;
  puVar1 = puVar11;
  if (lVar13 == 0) {
    if (*(long *)(this + 8) != 0) {
      lVar13 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->first).definition + lVar13);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(p->first).configRule + lVar13);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)puVar11 + lVar13 + 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        *(undefined8 *)((long)puVar11 + lVar13) = uVar7;
        ((undefined8 *)((long)puVar11 + lVar13))[1] = uVar8;
        lVar13 = lVar13 + 0x20;
      } while (lVar12 != lVar13);
    }
  }
  else {
    for (; ppVar10 != pos; ppVar10 = ppVar10 + 1) {
      pSVar4 = (ppVar10->first).definition;
      pCVar5 = (ppVar10->first).configRoot;
      pHVar6 = ppVar10->second;
      puVar1[2] = (ppVar10->first).configRule;
      puVar1[3] = pHVar6;
      *puVar1 = pSVar4;
      puVar1[1] = pCVar5;
      puVar1 = puVar1 + 4;
    }
    memcpy((void *)((long)puVar11 + lVar15 + 0x20),pos,(lVar13 - 0x20U & 0xffffffffffffffe0) + 0x20)
    ;
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar14;
  *(undefined8 **)this = puVar11;
  return (pointer)((long)puVar11 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}